

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources>::SharedPtr
          (SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources> *this,Resources *ptr)

{
  Resources *pRVar1;
  SharedPtrState<vkt::api::(anonymous_namespace)::Image::Resources,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Image::Resources>_>
  *pSVar2;
  DefaultDeleter<vkt::api::(anonymous_namespace)::Image::Resources> local_25 [13];
  Resources *local_18;
  Resources *ptr_local;
  SharedPtr<vkt::api::(anonymous_namespace)::Image::Resources> *this_local;
  
  this->m_ptr = (Resources *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Resources *)this;
  pSVar2 = (SharedPtrState<vkt::api::(anonymous_namespace)::Image::Resources,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Image::Resources>_>
            *)operator_new(0x20);
  pRVar1 = local_18;
  DefaultDeleter<vkt::api::(anonymous_namespace)::Image::Resources>::DefaultDeleter(local_25);
  SharedPtrState<vkt::api::(anonymous_namespace)::Image::Resources,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::Image::Resources>_>
  ::SharedPtrState(pSVar2,pRVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}